

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

size_t google::protobuf::internal::VarintSize<false,false,unsigned_int>(uint *data,int n)

{
  uint uVar1;
  int local_20;
  uint32 x;
  int i;
  uint32 msb_sum;
  uint32 sum;
  int n_local;
  uint *data_local;
  
  i = n;
  for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
    uVar1 = data[local_20];
    if (0x7f < uVar1) {
      i = i + 1;
    }
    if (0x3fff < uVar1) {
      i = i + 1;
    }
    if (0x1fffff < uVar1) {
      i = i + 1;
    }
    if (0xfffffff < uVar1) {
      i = i + 1;
    }
  }
  return (ulong)(uint)i;
}

Assistant:

static size_t VarintSize(const T* data, const int n) {
  static_assert(sizeof(T) == 4, "This routine only works for 32 bit integers");
  // is_unsigned<T> => !ZigZag
  static_assert(
      (std::is_unsigned<T>::value ^ ZigZag) || std::is_signed<T>::value,
      "Cannot ZigZag encode unsigned types");
  // is_unsigned<T> => !SignExtended
  static_assert(
      (std::is_unsigned<T>::value ^ SignExtended) || std::is_signed<T>::value,
      "Cannot SignExtended unsigned types");
  static_assert(!(SignExtended && ZigZag),
                "Cannot SignExtended and ZigZag on the same type");
  uint32 sum = n;
  uint32 msb_sum = 0;
  for (int i = 0; i < n; i++) {
    uint32 x = data[i];
    if (ZigZag) {
      x = WireFormatLite::ZigZagEncode32(x);
    } else if (SignExtended) {
      msb_sum += x >> 31;
    }
    // clang is so smart that it produces optimal SSE sequence unrolling
    // the loop 8 ints at a time. With a sequence of 4
    // cmpres = cmpgt x, sizeclass  ( -1 or 0)
    // sum = sum - cmpres
    if (x > 0x7F) sum++;
    if (x > 0x3FFF) sum++;
    if (x > 0x1FFFFF) sum++;
    if (x > 0xFFFFFFF) sum++;
  }
  if (SignExtended) sum += msb_sum * 5;
  return sum;
}